

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_date.cpp
# Opt level: O3

string * __thiscall
cornelich::cycle_formatter_yyyymmddhhmm::date_from_cycle_impl_abi_cxx11_
          (string *__return_storage_ptr__,cycle_formatter_yyyymmddhhmm *this,int64_t cycle)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  vector_type attr;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sink;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>
  that_4;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>
  that_3;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>
  that_2;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>
  that_1;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>
  that;
  void_ local_1bf;
  unused_type local_1be;
  reverse_fold_impl<_20593ad4_> local_1bd;
  uint local_1bc;
  uint local_1b8;
  int local_1b4;
  int *local_1b0;
  uint *local_1a8;
  uint *local_1a0;
  long *local_198;
  long *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  string **local_178;
  long local_170;
  long local_168;
  string *local_160;
  result_type local_158;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>
  local_124;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>
  local_118;
  undefined4 local_10c;
  undefined1 local_108;
  undefined4 local_100;
  undefined1 local_fc;
  undefined4 local_f4;
  undefined1 local_f0;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>
  local_e8;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>
  local_d8;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>
  local_c8;
  undefined4 *local_b8;
  undefined1 *local_b0;
  undefined4 *local_a8;
  undefined1 *local_a0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>
  local_98;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>
  local_88;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>
  local_78;
  expr<_1b4c652e_> local_68;
  car_type local_58;
  car_type cStack_50;
  car_type local_48;
  car_type cStack_40;
  car_type local_38;
  
  lVar3 = (this->super_cycle_formatter).m_cycle_length * cycle;
  uVar5 = SUB168(SEXT816(lVar3) * SEXT816(0x20c49ba5e353f7cf),8);
  lVar8 = ((uVar5 >> 7) - ((long)uVar5 >> 0x3f)) * 1000000000;
  lVar3 = lVar3 / 86400000;
  iVar4 = (int)lVar3 - (uint)(lVar8 < lVar3 * 86400000000000);
  uVar1 = (iVar4 + 0xafa6cU) / 0x23ab1;
  uVar6 = uVar1 * -0x23ab1 + iVar4 + 0xafa6c;
  uVar2 = ((uVar6 >> 2) / 0x23ab + uVar6) - (uVar6 / 0x23ab0 + (uVar6 >> 2) / 0x16d);
  iVar7 = (uVar6 - uVar2 / 0x5b4) + uVar2 / 0x8e94 + (uVar2 / 0x16d) * -0x16d;
  uVar6 = iVar7 * 5 + 2;
  local_1b8 = uVar6 / 0x99 + 3;
  if (0x5f9 < uVar6) {
    local_1b8 = uVar6 / 0x99 - 9;
  }
  lVar8 = (long)iVar4 * -86400000000000 + lVar8;
  local_168 = lVar8 / 3600000000000;
  local_170 = (lVar8 % 3600000000000) / 60000000000;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_178 = &local_160;
  local_a8 = &local_f4;
  local_f4 = 4;
  local_f0 = 0x30;
  local_98.child0 = (proto_child0)&local_a8;
  local_a0 = &boost::spirit::int_;
  local_b8 = &local_100;
  local_100 = 2;
  local_fc = 0x30;
  local_98.child1 = (proto_child1)&local_b8;
  local_b0 = &boost::spirit::uint_;
  local_88.child0 = &local_98;
  local_c8.child0 = (proto_child0)&local_10c;
  local_10c = 2;
  local_108 = 0x30;
  local_88.child1 = &local_c8;
  local_c8.child1 = (proto_child1)&boost::spirit::uint_;
  local_78.child0 = &local_88;
  local_d8.child0 = &local_118;
  local_118.child0.args.
  super_vector_data<boost::fusion::detail::index_sequence<0UL,_1UL>,_int,_char>.
  super_store<0UL,_int>.elem = 2;
  local_118.child0.args.
  super_vector_data<boost::fusion::detail::index_sequence<0UL,_1UL>,_int,_char>.
  super_store<1UL,_char>.elem = '0';
  local_78.child1 = &local_d8;
  local_d8.child1 = (proto_child1)&boost::spirit::uint_;
  local_68.child0 = &local_78;
  local_e8.child0 = &local_124;
  local_124.child0.args.
  super_vector_data<boost::fusion::detail::index_sequence<0UL,_1UL>,_int,_char>.
  super_store<0UL,_int>.elem = 2;
  local_124.child0.args.
  super_vector_data<boost::fusion::detail::index_sequence<0UL,_1UL>,_int,_char>.
  super_store<1UL,_char>.elem = '0';
  local_68.child1 = &local_e8;
  local_e8.child1 = (proto_child1)&boost::spirit::uint_;
  local_1b4 = (int)(short)((short)uVar1 * 400 +
                           (short)((uint)((ulong)uVar2 * 0x16719f361 >> 0x21) >> 8) +
                          (ushort)(local_1b8 < 3));
  local_1b0 = &local_1b4;
  local_1b8 = local_1b8 & 0xff;
  local_1a8 = &local_1b8;
  local_1bc = (iVar7 - ((uVar6 / 0x99) * 0x99 + 2) / 5) + 1 & 0xff;
  local_1a0 = &local_1bc;
  local_198 = &local_168;
  local_190 = &local_170;
  local_188 = 0;
  uStack_180 = 0;
  local_160 = __return_storage_ptr__;
  boost::proto::detail::reverse_fold_impl<$20593ad4$>::operator()
            (&local_158,&local_1bd,&local_68,&local_1bf,&local_1be);
  local_58._0_1_ = local_158.car._0_1_;
  local_58.padding.ch = local_158.car.padding.ch;
  local_58._2_2_ = local_158.car._2_2_;
  local_58.width = local_158.car.width;
  cStack_50._0_1_ = local_158.cdr.car._0_1_;
  cStack_50.padding.ch = local_158.cdr.car.padding.ch;
  cStack_50._2_2_ = local_158.cdr.car._2_2_;
  cStack_50.width = local_158.cdr.car.width;
  local_48._0_1_ = local_158.cdr.cdr.car._0_1_;
  local_48.padding.ch = local_158.cdr.cdr.car.padding.ch;
  local_48._2_2_ = local_158.cdr.cdr.car._2_2_;
  local_48.width = local_158.cdr.cdr.car.width;
  cStack_40._0_1_ = local_158.cdr.cdr.cdr.car._0_1_;
  cStack_40.padding.ch = local_158.cdr.cdr.cdr.car.padding.ch;
  cStack_40._2_2_ = local_158.cdr.cdr.cdr.car._2_2_;
  cStack_40.width = local_158.cdr.cdr.cdr.car.width;
  local_38 = local_158.cdr.cdr.cdr.cdr.car;
  boost::spirit::karma::
  base_sequence<boost::fusion::cons<boost::spirit::karma::padding_right_alignment<boost::spirit::karma::any_int_generator<int,boost::spirit::unused_type,boost::spirit::unused_type,10u,false>,boost::spirit::karma::literal_char<boost::spirit::char_encoding::standard,boost::spirit::unused_type,true>,int>,boost::fusion::cons<boost::spirit::karma::padding_right_alignment<boost::spirit::karma::any_uint_generator<unsigned_int,boost::spirit::unused_type,boost::spirit::unused_type,10u>,boost::spirit::karma::literal_char<boost::spirit::char_encoding::standard,boost::spirit::unused_type,true>,int>,boost::fusion::cons<boost::spirit::karma::padding_right_alignment<boost::spirit::karma::any_uint_generator<unsigned_int,boost::spirit::unused_type,boost::spirit::unused_type,10u>,boost::spirit::karma::literal_char<boost::spirit::char_encoding::standard,boost::spirit::unused_type,true>,int>,boost::fusion::cons<boost::spirit::karma::padding_right_alignment<boost::spirit::karma::any_uint_generator<unsigned_i...st::spirit::char_encoding::standard,boost::spirit::unused_type,true>,int>,boost::fusion::nil_>>>>>>>
  ::
  generate_impl<boost::spirit::karma::detail::output_iterator<std::back_insert_iterator<std::__cxx11::string>,mpl_::int_<3>,boost::spirit::unused_type>,boost::spirit::unused_type_const,boost::spirit::unused_type,boost::fusion::vector<int_const&,unsigned_int_const&,unsigned_int_const&,long_const&,long_const&>const,mpl_::bool_<false>,mpl_::bool_<false>>
            ((base_sequence<boost::fusion::cons<boost::spirit::karma::padding_right_alignment<boost::spirit::karma::any_int_generator<int,boost::spirit::unused_type,boost::spirit::unused_type,10u,false>,boost::spirit::karma::literal_char<boost::spirit::char_encoding::standard,boost::spirit::unused_type,true>,int>,boost::fusion::cons<boost::spirit::karma::padding_right_alignment<boost::spirit::karma::any_uint_generator<unsigned_int,boost::spirit::unused_type,boost::spirit::unused_type,10u>,boost::spirit::karma::literal_char<boost::spirit::char_encoding::standard,boost::spirit::unused_type,true>,int>,boost::fusion::cons<boost::spirit::karma::padding_right_alignment<boost::spirit::karma::any_uint_generator<unsigned_int,boost::spirit::unused_type,boost::spirit::unused_type,10u>,boost::spirit::karma::literal_char<boost::spirit::char_encoding::standard,boost::spirit::unused_type,true>,int>,boost::fusion::cons<boost::spirit::karma::padding_right_alignment<boost::spirit::karma::any_uint_generator<unsigned_i___st::spirit::char_encoding::standard,boost::spirit::unused_type,true>,int>,boost::fusion::nil_>>>>>>>
              *)&local_58,&local_188,&boost::spirit::unused,&boost::spirit::unused,&local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string cycle_formatter_yyyymmddhhmm::date_from_cycle_impl(std::int64_t cycle) const
{
    const auto s = static_cast<std::time_t>(cycle * m_cycle_length / 1000);
    auto ts = system_clock::time_point(seconds(s));
    auto daypoint = floor<days>(ts);
    auto ymd = year_month_day(daypoint);
    auto tod = make_time(ts - daypoint);

    using namespace boost::spirit;

    std::string result;
    std::back_insert_iterator<std::string> sink(result);
    karma::generate(sink,
                    karma::right_align(4, '0')[karma::int_] << karma::right_align(2, '0')[karma::uint_] << karma::right_align(2, '0')[karma::uint_] << karma::right_align(2, '0')[karma::uint_] << karma::right_align(2, '0')[karma::uint_],
            int(ymd.year()), unsigned(ymd.month()), unsigned(ymd.day()), tod.hours().count(), tod.minutes().count());
    return result;
}